

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAddBuffs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_4c;
  int fVerbose;
  int c;
  int nImprove;
  int fReverse;
  int fDirect;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  nImprove = 0;
  c = 0;
  fVerbose = 1000;
  local_4c = 0;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"Idrvh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsLogic(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command can only be applied to a logic network.\n");
        return 1;
      }
      pAVar2 = Abc_NtkAddBuffs(pAVar2,nImprove,c,fVerbose,local_4c);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"The command has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    switch(iVar1) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by a positive integer.\n");
        goto LAB_0026ce39;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fVerbose < 0) {
LAB_0026ce39:
        Abc_Print(-2,"usage: addbuffs [-I num] [-drvh]\n");
        Abc_Print(-2,"\t           adds buffers to create balanced CI/CO paths\n");
        Abc_Print(-2,"\t-I <num> : the number of refinement iterations [default = %d]\n",
                  (ulong)(uint)fVerbose);
        pcVar3 = "no";
        if (nImprove != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-d       : toggle using only CI-to-CO levelized order [default = %s]\n",
                  pcVar3);
        pcVar3 = "no";
        if (c != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-r       : toggle using only CO-to-C1 levelized order [default = %s]\n",
                  pcVar3);
        pcVar3 = "no";
        if (local_4c != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
        Abc_Print(-2,"\t-h       : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_0026ce39;
    case 100:
      nImprove = nImprove ^ 1;
      break;
    case 0x68:
      goto LAB_0026ce39;
    case 0x72:
      c = c ^ 1;
      break;
    case 0x76:
      local_4c = local_4c ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAddBuffs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkAddBuffs( Abc_Ntk_t * pNtk, int fDirect, int fReverse, int nImprove, int fVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Ntk_t * pNtkRes;
    int fDirect;
    int fReverse;
    int nImprove;
    int c, fVerbose;

    fDirect  = 0;
    fReverse = 0;
    nImprove = 1000;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Idrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nImprove = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nImprove < 0 )
                goto usage;
            break;
        case 'd':
            fDirect ^= 1;
            break;
        case 'r':
            fReverse ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }

    // modify the current network
    pNtkRes = Abc_NtkAddBuffs( pNtk, fDirect, fReverse, nImprove, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: addbuffs [-I num] [-drvh]\n" );
    Abc_Print( -2, "\t           adds buffers to create balanced CI/CO paths\n" );
    Abc_Print( -2, "\t-I <num> : the number of refinement iterations [default = %d]\n", nImprove );
    Abc_Print( -2, "\t-d       : toggle using only CI-to-CO levelized order [default = %s]\n", fDirect? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle using only CO-to-C1 levelized order [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}